

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less_equal>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less_equal *comp)

{
  char cVar1;
  char cVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  xpath_allocator_capture *this;
  xpath_node *pxVar6;
  xpath_memory_block *pxVar7;
  xpath_string xVar8;
  xpath_allocator_capture cr;
  xpath_node_set_raw rs;
  xpath_node_set_raw ls;
  xpath_allocator_capture cri;
  xpath_allocator_capture crii;
  xpath_allocator_capture local_b8;
  xpath_allocator *local_a0;
  xpath_memory_block *local_98;
  xpath_memory_block *pxStack_90;
  xpath_node_set_raw local_80;
  xpath_allocator_capture local_60;
  xpath_allocator_capture local_48;
  
  cVar1 = lhs->_rettype;
  cVar2 = rhs->_rettype;
  if (cVar2 != '\x01' && cVar1 != '\x01') {
    dVar3 = eval_number(lhs,c,stack);
    dVar4 = eval_number(rhs,c,stack);
    return dVar3 <= dVar4;
  }
  if (cVar2 == '\x01' && cVar1 == '\x01') {
    local_b8._target = stack->result;
    local_b8._state._root = (local_b8._target)->_root;
    local_b8._state._root_size = (local_b8._target)->_root_size;
    eval_node_set(&local_80,lhs,c,stack);
    eval_node_set((xpath_node_set_raw *)&local_a0,rhs,c,stack);
    if (local_80._begin != local_80._end) {
      pxVar6 = local_80._begin;
      do {
        local_60._target = stack->result;
        local_60._state._root = (local_60._target)->_root;
        local_60._state._root_size = (local_60._target)->_root_size;
        xVar8 = string_value((anon_unknown_0 *)(pxVar6->_node)._root,
                             (xpath_node *)(pxVar6->_attribute)._attr,local_60._target);
        dVar3 = convert_string_to_number(xVar8._buffer);
        for (pxVar7 = local_98; pxVar7 != pxStack_90;
            pxVar7 = (xpath_memory_block *)(pxVar7->data + 8)) {
          local_48._target = stack->result;
          local_48._state._root = (local_48._target)->_root;
          local_48._state._root_size = (local_48._target)->_root_size;
          xVar8 = string_value((anon_unknown_0 *)pxVar7->next,*(xpath_node **)pxVar7->data,
                               local_48._target);
          dVar4 = convert_string_to_number(xVar8._buffer);
          xpath_allocator_capture::~xpath_allocator_capture(&local_48);
          if (dVar3 <= dVar4) {
            xpath_allocator_capture::~xpath_allocator_capture(&local_60);
            bVar5 = true;
            goto LAB_0011ffb3;
          }
        }
        xpath_allocator_capture::~xpath_allocator_capture(&local_60);
        pxVar6 = pxVar6 + 1;
      } while (pxVar6 != local_80._end);
    }
    bVar5 = false;
LAB_0011ffb3:
    this = &local_b8;
    goto LAB_00120070;
  }
  if (cVar1 == '\x01' || cVar2 != '\x01') {
    if ((cVar1 != '\x01') || (cVar2 == '\x01')) {
      __assert_fail("!\"Wrong types\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                    ,0x1d8b,
                    "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less_equal]"
                   );
    }
    local_a0 = stack->result;
    local_98 = local_a0->_root;
    pxStack_90 = (xpath_memory_block *)local_a0->_root_size;
    eval_node_set(&local_80,lhs,c,stack);
    dVar3 = eval_number(rhs,c,stack);
    if (local_80._begin == local_80._end) goto LAB_00120069;
    pxVar6 = local_80._begin;
    do {
      local_b8._target = stack->result;
      local_b8._state._root = (local_b8._target)->_root;
      local_b8._state._root_size = (local_b8._target)->_root_size;
      xVar8 = string_value((anon_unknown_0 *)(pxVar6->_node)._root,
                           (xpath_node *)(pxVar6->_attribute)._attr,local_b8._target);
      dVar4 = convert_string_to_number(xVar8._buffer);
      xpath_allocator_capture::~xpath_allocator_capture(&local_b8);
      bVar5 = dVar4 <= dVar3;
      if (bVar5) break;
      pxVar6 = pxVar6 + 1;
    } while (pxVar6 != local_80._end);
  }
  else {
    local_a0 = stack->result;
    local_98 = local_a0->_root;
    pxStack_90 = (xpath_memory_block *)local_a0->_root_size;
    dVar3 = eval_number(lhs,c,stack);
    eval_node_set(&local_80,rhs,c,stack);
    if (local_80._begin == local_80._end) {
LAB_00120069:
      bVar5 = false;
    }
    else {
      pxVar6 = local_80._begin;
      do {
        local_b8._target = stack->result;
        local_b8._state._root = (local_b8._target)->_root;
        local_b8._state._root_size = (local_b8._target)->_root_size;
        xVar8 = string_value((anon_unknown_0 *)(pxVar6->_node)._root,
                             (xpath_node *)(pxVar6->_attribute)._attr,local_b8._target);
        dVar4 = convert_string_to_number(xVar8._buffer);
        xpath_allocator_capture::~xpath_allocator_capture(&local_b8);
        bVar5 = dVar3 <= dVar4;
        if (bVar5) break;
        pxVar6 = pxVar6 + 1;
      } while (pxVar6 != local_80._end);
    }
  }
  this = (xpath_allocator_capture *)&local_a0;
LAB_00120070:
  xpath_allocator_capture::~xpath_allocator_capture(this);
  return bVar5;
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(!"Wrong types");
				return false;
			}
		}